

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellUtility.cpp
# Opt level: O2

void __thiscall
llbuild::basic::appendShellEscapedString(basic *this,raw_ostream *os,StringRef string)

{
  StringRef Str;
  StringRef Str_00;
  char cVar1;
  int iVar2;
  size_type sVar3;
  raw_ostream *this_00;
  size_type sVar4;
  size_t idx;
  StringRef Chars;
  StringRef Chars_00;
  StringRef Str_01;
  allocator local_51;
  StringRef string_local;
  string escQuote;
  
  string_local.Length = (size_t)string.Data;
  string_local.Data = (char *)os;
  if (appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::whitelist_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::
                                 whitelist_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::whitelist_abi_cxx11_
                 ,"abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ1234567890-_/:@#%+=.,",
                 (allocator *)&escQuote);
      __cxa_atexit(std::__cxx11::string::~string,
                   &appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::
                    whitelist_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::
                           whitelist_abi_cxx11_);
    }
  }
  Chars.Length = appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::whitelist_abi_cxx11_.
                 _M_string_length;
  Chars.Data = appendShellEscapedString(llvm::raw_ostream&,llvm::StringRef)::whitelist_abi_cxx11_.
               _M_dataplus._M_p;
  sVar3 = llvm::StringRef::find_first_not_of(&string_local,Chars,0);
  if (sVar3 == 0xffffffffffffffff) {
    Str.Length = string_local.Length;
    Str.Data = string_local.Data;
    llvm::raw_ostream::operator<<((raw_ostream *)this,Str);
  }
  else {
    std::__cxx11::string::string((string *)&escQuote,"\'",&local_51);
    Chars_00.Length = 1;
    Chars_00.Data = "\'";
    sVar3 = llvm::StringRef::find_first_of(&string_local,Chars_00,sVar3);
    this_00 = llvm::raw_ostream::operator<<((raw_ostream *)this,"\'");
    if (sVar3 == 0xffffffffffffffff) {
      Str_00.Length = string_local.Length;
      Str_00.Data = string_local.Data;
      this = (basic *)llvm::raw_ostream::operator<<(this_00,Str_00);
    }
    else {
      sVar4 = sVar3;
      if (string_local.Length < sVar3) {
        sVar4 = string_local.Length;
      }
      Str_01.Length = sVar4;
      Str_01.Data = string_local.Data;
      llvm::raw_ostream::operator<<((raw_ostream *)this,Str_01);
      for (; sVar3 < string_local.Length; sVar3 = sVar3 + 1) {
        cVar1 = llvm::StringRef::operator[](&string_local,sVar3);
        if (cVar1 == '\'') {
          llvm::raw_ostream::operator<<((raw_ostream *)this,"\'\\\'\'");
        }
        else {
          cVar1 = llvm::StringRef::operator[](&string_local,sVar3);
          llvm::raw_ostream::operator<<((raw_ostream *)this,cVar1);
        }
      }
    }
    llvm::raw_ostream::operator<<((raw_ostream *)this,"\'");
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void appendShellEscapedString(llvm::raw_ostream& os, StringRef string) {
#if defined(_WIN32)
  os << formatWindowsCommandArg(string);
  return;
#else
  static const std::string whitelist = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ1234567890-_/:@#%+=.,";
  auto pos = string.find_first_not_of(whitelist);

  // We don't need any escaping just append the string and return.
  if (pos == std::string::npos) {
    os << string;
    return;
  }

  std::string escQuote = "'";
  // We only need to escape the single quote, if it isn't present we can
  // escape using single quotes.
  auto singleQuotePos = string.find_first_of("'" , pos);
  if (singleQuotePos == std::string::npos) {
    os << "'" << string << "'";
    return;
  }

  // Otherwise iterate and escape all the single quotes.
  os << "'";
  os << string.slice(0, singleQuotePos);
  for (auto idx = singleQuotePos; idx < string.size(); idx++) {
    if (string[idx] == '\'') {
      os << "'\\''";
    } else {
      os << string[idx];
    }
  }
  os << "'";
#endif
}